

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_extrude.cpp
# Opt level: O1

ON_SumSurface *
ON_BrepExtrudeHelper_MakeSumSrf(ON_Curve *path_curve,ON_BrepEdge *base_edge,bool bRev)

{
  int iVar1;
  int iVar2;
  ON_Curve *pOVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ON_SumSurface *this;
  ON_3dPoint sum_basepoint;
  ON_3dPoint local_a0;
  ON_BoundingBox local_88;
  ON_3dPoint local_58;
  ON_3dVector local_40;
  
  pOVar3 = ON_CurveProxy::ProxyCurve(&base_edge->super_ON_CurveProxy);
  if (pOVar3 == (ON_Curve *)0x0) {
    this = (ON_SumSurface *)0x0;
  }
  else {
    iVar1 = (*(path_curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x24])(path_curve);
    iVar2 = (*(base_edge->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
              _vptr_ON_Object[0x24])(base_edge);
    pOVar3 = (ON_Curve *)CONCAT44(extraout_var_00,iVar2);
    if (!bRev) {
      (*(pOVar3->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x38])(pOVar3);
    }
    ON_Curve::PointAtStart(&local_58,(ON_Curve *)CONCAT44(extraout_var,iVar1));
    ON_3dVector::ON_3dVector(&local_40,&local_58);
    ON_3dVector::operator-((ON_3dVector *)&local_88,&local_40);
    ON_3dPoint::ON_3dPoint(&local_a0,(ON_3dVector *)&local_88);
    this = (ON_SumSurface *)operator_new(0x68);
    ON_SumSurface::ON_SumSurface(this);
    this->m_curve[0] = pOVar3;
    this->m_curve[1] = (ON_Curve *)CONCAT44(extraout_var,iVar1);
    ON_3dVector::operator=(&this->m_basepoint,&local_a0);
    ON_Geometry::BoundingBox(&local_88,(ON_Geometry *)this);
  }
  return this;
}

Assistant:

static
ON_SumSurface* ON_BrepExtrudeHelper_MakeSumSrf( const ON_Curve& path_curve,
                                                 const ON_BrepEdge& base_edge, bool bRev )
{
  ON_SumSurface* sum_srf = 0;
  // create side surface
  if ( base_edge.ProxyCurve() )
  {
    ON_Curve* srf_path_curve = path_curve.DuplicateCurve();
    ON_Curve* srf_base_curve = base_edge.DuplicateCurve();
    if ( !bRev )
      srf_base_curve->Reverse();
    ON_3dPoint sum_basepoint = -ON_3dVector(srf_path_curve->PointAtStart());
    sum_srf = new ON_SumSurface();
    sum_srf->m_curve[0] = srf_base_curve;
    sum_srf->m_curve[1] = srf_path_curve;
    sum_srf->m_basepoint = sum_basepoint;
    sum_srf->BoundingBox(); // fills in sum_srf->m_bbox
  }
  return sum_srf;
}